

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_ref.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
absl::lts_20250127::functional_internal::
InvokeObject<google::protobuf::DescriptorBuilder::BuildFileImpl(google::protobuf::FileDescriptorProto_const&,google::protobuf::internal::FlatAllocator&)::__0,std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,functional_internal *this,VoidPtr ptr)

{
  undefined8 *puVar1;
  AlphaNum local_70;
  string_view local_40 [3];
  
  local_40[0] = NullSafeStringView("Unrecognized syntax: ");
  puVar1 = (undefined8 *)(*(ulong *)(*(long *)this + 0xd8) & 0xfffffffffffffffc);
  local_70.piece_._M_str = (char *)*puVar1;
  local_70.piece_._M_len = puVar1[1];
  StrCat_abi_cxx11_(__return_storage_ptr__,(lts_20250127 *)local_40,&local_70,
                    (AlphaNum *)local_70.piece_._M_str);
  return __return_storage_ptr__;
}

Assistant:

R InvokeObject(VoidPtr ptr, typename ForwardT<Args>::type... args) {
  auto o = static_cast<const Obj*>(ptr.obj);
  return static_cast<R>(
      absl::base_internal::invoke(*o, std::forward<Args>(args)...));
}